

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O2

char ** __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
eat_ws_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  if (((byte)this[0x211] & 0x20) == 0) {
    return begin;
  }
  uVar2 = *(ushort *)(this + 0x214);
  pbVar5 = (byte *)*begin;
  do {
    while( true ) {
      if (pbVar5 == (byte *)end) {
        return begin;
      }
      if ((ulong)*pbVar5 != 0x23) {
        if (uVar2 == 0) {
          return begin;
        }
        if ((*(ushort *)(this + (ulong)*pbVar5 * 2) & uVar2) == 0) {
          return begin;
        }
      }
      pbVar4 = pbVar5 + 1;
      *begin = (char *)pbVar4;
      if (*pbVar5 == 0x23) break;
      uVar3 = *(ushort *)(this + 0x214);
      while (((pbVar5 = pbVar4, pbVar4 != (byte *)end && (uVar3 != 0)) &&
             ((*(ushort *)(this + (ulong)*pbVar4 * 2) & uVar3) != 0))) {
        pbVar4 = pbVar4 + 1;
        *begin = (char *)pbVar4;
      }
    }
    do {
      pbVar5 = pbVar4;
      if (pbVar4 == (byte *)end) break;
      pbVar5 = pbVar4 + 1;
      *begin = (char *)pbVar5;
      bVar1 = *pbVar4;
      pbVar4 = pbVar5;
    } while (bVar1 != 10);
  } while( true );
}

Assistant:

FwdIter &eat_ws_(FwdIter &begin, FwdIter end)
    {
        if(0 != (regex_constants::ignore_white_space & this->flags()))
        {
            while(end != begin && (BOOST_XPR_CHAR_(char_type, '#') == *begin || this->is_space_(*begin)))
            {
                if(BOOST_XPR_CHAR_(char_type, '#') == *begin++)
                {
                    while(end != begin && BOOST_XPR_CHAR_(char_type, '\n') != *begin++) {}
                }
                else
                {
                    for(; end != begin && this->is_space_(*begin); ++begin) {}
                }
            }
        }

        return begin;
    }